

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O0

void __thiscall
FParser::ParseVarLine(FParser *this,int newvar_type,DFsScript *newvar_script,int start)

{
  int iVar1;
  int local_28;
  int endtoken;
  int starttoken;
  int start_local;
  DFsScript *newvar_script_local;
  int newvar_type_local;
  FParser *this_local;
  
  local_28 = start;
  while( true ) {
    iVar1 = FindOperator(this,local_28,this->NumTokens + -1,",");
    if (iVar1 == -1) break;
    CreateVariable(this,newvar_type,newvar_script,local_28,iVar1 + -1);
    local_28 = iVar1 + 1;
  }
  CreateVariable(this,newvar_type,newvar_script,local_28,this->NumTokens + -1);
  return;
}

Assistant:

void FParser::ParseVarLine(int newvar_type, DFsScript *newvar_script, int start)
{
	int starttoken = start, endtoken;
	
	while(1)
    {
		endtoken = FindOperator(starttoken, NumTokens-1, ",");
		if(endtoken == -1) break;
		CreateVariable(newvar_type, newvar_script, starttoken, endtoken-1);
		starttoken = endtoken+1;  //start next after end of this one
    }
	// dont forget the last one
	CreateVariable(newvar_type, newvar_script, starttoken, NumTokens-1);
}